

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool mkvmuxer::ChunkedCopy(IMkvReader *source,IMkvWriter *dst,int64_t start,int64_t size)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  pvVar3 = operator_new__(0x800);
  if (0 < size) {
    do {
      uVar5 = 0x800;
      if ((ulong)size < 0x800) {
        uVar5 = size;
      }
      iVar2 = (**source->_vptr_IMkvReader)(source,start,uVar5,pvVar3);
      if (iVar2 != 0) {
        return false;
      }
      (**dst->_vptr_IMkvWriter)(dst,pvVar3,uVar5 & 0xffffffff);
      start = start + uVar5;
      uVar4 = size - uVar5;
      bVar1 = (long)uVar5 <= size;
      size = uVar4;
    } while (uVar4 != 0 && bVar1);
  }
  operator_delete__(pvVar3);
  return true;
}

Assistant:

bool ChunkedCopy(mkvparser::IMkvReader* source, mkvmuxer::IMkvWriter* dst,
                 int64_t start, int64_t size) {
  // TODO(vigneshv): Check if this is a reasonable value.
  const uint32_t kBufSize = 2048;
  uint8_t* buf = new uint8_t[kBufSize];
  int64_t offset = start;
  while (size > 0) {
    const int64_t read_len = (size > kBufSize) ? kBufSize : size;
    if (source->Read(offset, static_cast<long>(read_len), buf))
      return false;
    dst->Write(buf, static_cast<uint32_t>(read_len));
    offset += read_len;
    size -= read_len;
  }
  delete[] buf;
  return true;
}